

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall
Json::StyledStreamWriter::writeCommentBeforeValue(StyledStreamWriter *this,Value *root)

{
  bool bVar1;
  reference pcVar2;
  Value *in_RSI;
  long in_RDI;
  const_iterator iter;
  string *comment;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff78;
  uint6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar3;
  ostream *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined8 local_60;
  CommentPlacement in_stack_ffffffffffffffb4;
  Value *in_stack_ffffffffffffffb8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  string local_38 [32];
  string *local_18;
  
  bVar1 = Value::hasComment(in_RSI,commentBefore);
  if (bVar1) {
    if ((*(byte *)(in_RDI + 0x68) >> 1 & 1) == 0) {
      writeIndent((StyledStreamWriter *)
                  CONCAT17(in_stack_ffffffffffffff87,
                           CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)));
    }
    Value::getComment_abi_cxx11_(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    local_18 = local_38;
    local_40._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff87,
                                     CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
                         in_stack_ffffffffffffff78);
      if (!bVar1) break;
      this_00 = *(ostream **)(in_RDI + 0x18);
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_40);
      std::operator<<(this_00,*pcVar2);
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_40);
      uVar3 = false;
      in_stack_ffffffffffffff87 = uVar3;
      if (*pcVar2 == '\n') {
        local_60 = std::__cxx11::string::end();
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff86,
                                                      in_stack_ffffffffffffff80)),
                           in_stack_ffffffffffffff78);
        in_stack_ffffffffffffff86 = false;
        in_stack_ffffffffffffff87 = in_stack_ffffffffffffff86;
        if (bVar1) {
          local_68 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)this_00,CONCAT17(uVar3,(uint7)in_stack_ffffffffffffff80));
          pcVar2 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_68);
          in_stack_ffffffffffffff86 = *pcVar2 == '/';
          in_stack_ffffffffffffff87 = in_stack_ffffffffffffff86;
        }
      }
      if ((bool)in_stack_ffffffffffffff87 != false) {
        std::operator<<(*(ostream **)(in_RDI + 0x18),(string *)(in_RDI + 0x20));
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_40);
    }
    *(byte *)(in_RDI + 0x68) = *(byte *)(in_RDI + 0x68) & 0xfd;
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void StyledStreamWriter::writeCommentBeforeValue(const Value& root) {
  if (!root.hasComment(commentBefore))
    return;

  if (!indented_) writeIndent();
  const std::string& comment = root.getComment(commentBefore);
  std::string::const_iterator iter = comment.begin();
  while (iter != comment.end()) {
    *document_ << *iter;
    if (*iter == '\n' &&
       (iter != comment.end() && *(iter + 1) == '/'))
      // writeIndent();  // would include newline
      *document_ << indentString_;
    ++iter;
  }
  indented_ = false;
}